

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O2

int __thiscall
Kernel::LiteralSelector::select
          (LiteralSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds
          ,timeval *__timeout)

{
  Literal *pLVar1;
  int extraout_EAX;
  uint s;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_00000034;
  Clause *this_00;
  uint uVar5;
  bool bVar6;
  Literal *__tmp;
  int iVar7;
  
  s = (uint)__readfds;
  this_00 = (Clause *)CONCAT44(in_register_00000034,__nfds);
  if (s == 0) {
    s = *(uint *)&this_00->field_0x38 & 0xfffff;
  }
  if (1 < s) {
    iVar4 = (uint)((*(ushort *)
                     (*(long *)(*(long *)(DAT_00a14190 + 0x80) +
                               (ulong)(this_00->_literals[0]->super_Term)._functor * 8) + 0x40) &
                   0x420) == 0) * 2 + -2;
    bVar6 = false;
    uVar3 = 1;
    for (uVar5 = 1; uVar2 = (uint)uVar3, s != uVar5; uVar5 = uVar5 + 1) {
      pLVar1 = this_00->_literals[(int)uVar5];
      iVar7 = (uint)((*(ushort *)
                       (*(long *)(*(long *)(DAT_00a14190 + 0x80) +
                                 (ulong)(pLVar1->super_Term)._functor * 8) + 0x40) & 0x420) == 0) *
              2 + -2;
      if (iVar7 == iVar4) {
        if (uVar5 != uVar2) {
          this_00->_literals[(int)uVar5] = this_00->_literals[(int)uVar2];
          this_00->_literals[(int)uVar2] = pLVar1;
          bVar6 = true;
        }
        uVar3 = (ulong)(uVar2 + 1);
      }
      else if (iVar4 < iVar7) {
        this_00->_literals[(int)uVar5] = this_00->_literals[0];
        this_00->_literals[0] = pLVar1;
        bVar6 = true;
        uVar3 = 1;
        iVar4 = iVar7;
      }
    }
    if (bVar6) {
      Clause::notifyLiteralReorder(this_00);
    }
    if (uVar2 != 1) {
      iVar4 = (*this->_vptr_LiteralSelector[4])(this,this_00,uVar3);
      return iVar4;
    }
    s = 1;
  }
  Clause::setSelected(this_00,s);
  return extraout_EAX;
}

Assistant:

void LiteralSelector::select(Clause* c, unsigned eligibleInp)
{
  ASS_LE(eligibleInp, c->length());

  if(eligibleInp==0) {
    eligibleInp = c->length();
  }

  if(eligibleInp<=1) {
    c->setSelected(eligibleInp);
    return;
  }

  unsigned eligible=1;
  { /* we order the clause so that the literals with highest `getSelectionPriority` are in the front, and eligible is the number of literals with that selection priority */ 
    int maxPriority=getSelectionPriority((*c)[0]);
    bool modified=false;

    for (unsigned i = 1; i < eligibleInp; i++) {
      int priority = getSelectionPriority((*c)[i]);
      if (priority == maxPriority) {
        if (eligible != i) {
          swap((*c)[i], (*c)[eligible]);
          modified = true;
        }
        eligible++;
      } else if (priority > maxPriority) {
        maxPriority = priority;
        eligible = 1;
        swap((*c)[i], (*c)[0]);
        modified = true;
      }
    }
    ASS_LE(eligible,eligibleInp);
    if(modified) {
      c->notifyLiteralReorder();
    }
  }

  if(eligible==1) {
    c->setSelected(eligible);
    return;
  }

  ASS_G(eligible,1);
  doSelection(c, eligible);
}